

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_negative_Test::
SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_negative_Test
          (SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_negative_Test *this)

{
  SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_negative_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_negative_Test_003d3cc8;
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_fx_spot_stream_Quantity_must_not_be_negative)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    try
    {
        subject_factory.Fx().Quote().Spot()
                .CurrencyPair("EURGBP")
                .Currency("EUR")
                .Quantity(-1)
                .LiquidityProvider("CSFX")
                .CreateSubject()
                .ToString().c_str();
    }
    catch (InvalidSubjectException& e)
    {
        ASSERT_STREQ(e.what(), "dealt quantity must be a positive value: -1.00");
        return;
    }

    FAIL();
}